

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaB_ipairs(lua_State *L)

{
  StkId pTVar1;
  GCObject *pGVar2;
  TValue *pTVar3;
  
  luaL_checktype(L,1,5);
  pTVar1 = L->top;
  pGVar2 = (L->ci->func->value).gc;
  pTVar3 = (TValue *)&(pGVar2->h).lastfree;
  if ((pGVar2->h).lsizenode == '\0') {
    pTVar3 = &luaO_nilobject_;
  }
  pTVar1->value = pTVar3->value;
  pTVar1->tt = ((Value *)((long)pTVar3 + 8))->b;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar3 = &luaO_nilobject_;
  if (L->base < pTVar1 + 1) {
    pTVar3 = L->base;
  }
  pTVar1[1].value = pTVar3->value;
  pTVar1[1].tt = pTVar3->tt;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1[1].value.gc = (GCObject *)0x0;
  pTVar1[1].tt = 3;
  L->top = L->top + 1;
  return 3;
}

Assistant:

static int luaB_ipairs(lua_State*L){
luaL_checktype(L,1,5);
lua_pushvalue(L,lua_upvalueindex(1));
lua_pushvalue(L,1);
lua_pushinteger(L,0);
return 3;
}